

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleset.cpp
# Opt level: O3

void __thiscall Ruleset::rebuildRuleInstances(Ruleset *this)

{
  pointer *pppRVar1;
  pointer ppRVar2;
  pointer pcVar3;
  iterator __position;
  iterator iVar4;
  pointer ppVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*> pair
  ;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  Rule *local_68;
  vector<Rule*,std::allocator<Rule*>> *local_60;
  pointer local_58;
  key_type local_50;
  
  ppRVar2 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppRVar2) {
    (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppRVar2;
  }
  ppVar5 = (this->m_nameToRule).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (this->m_nameToRule).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != local_58) {
    local_60 = (vector<Rule*,std::allocator<Rule*>> *)&this->m_ruleInstances;
    do {
      local_88 = local_78;
      pcVar3 = (ppVar5->first)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar3,pcVar3 + (ppVar5->first)._M_string_length);
      local_68 = ppVar5->second;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_88,local_88 + local_80);
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->m_enabledRules)._M_t,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((_Rb_tree_header *)iVar4._M_node !=
          &(this->m_enabledRules)._M_t._M_impl.super__Rb_tree_header) {
        __position._M_current =
             (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Rule*,std::allocator<Rule*>>::_M_realloc_insert<Rule*const&>
                    (local_60,__position,&local_68);
        }
        else {
          *__position._M_current = local_68;
          pppRVar1 = &(this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppRVar1 = *pppRVar1 + 1;
        }
      }
      if (local_88 != local_78) {
        operator_delete(local_88);
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != local_58);
  }
  return;
}

Assistant:

void Ruleset::rebuildRuleInstances(){
    m_ruleInstances.clear();
    for(const auto pair : m_nameToRule){
        if(isEnabled(pair.first)){
            m_ruleInstances.push_back(pair.second);
        }
    }
}